

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O2

void append_scopeid(sockaddr_in6 *addr6,uint flags,char *buf,size_t buflen)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char tmpbuf [18];
  
  tmpbuf[0] = '%';
  uVar1 = (addr6->sin6_addr).__in6_u.__u6_addr32[0];
  if ((((char)flags < '\0') || ((uVar1 & 0xc0ff) != 0x80fe && (uVar1 & 0xfff) != 0x2ff)) ||
     (pcVar2 = if_indextoname(addr6->sin6_scope_id,tmpbuf + 1), pcVar2 == (char *)0x0)) {
    snprintf(tmpbuf + 1,0x11,"%lu",(ulong)addr6->sin6_scope_id);
  }
  tmpbuf[0x11] = '\0';
  sVar3 = ares_strlen(buf);
  sVar4 = ares_strlen(tmpbuf);
  if (sVar4 + sVar3 < 0x3e) {
    ares_strcpy(buf + sVar3,tmpbuf,0x3e - sVar3);
  }
  return;
}

Assistant:

static void append_scopeid(const struct sockaddr_in6 *addr6, unsigned int flags,
                           char *buf, size_t buflen)
{
#  ifdef HAVE_IF_INDEXTONAME
  int is_ll;
  int is_mcll;
#  endif
  char   tmpbuf[IF_NAMESIZE + 2];
  size_t bufl;

  tmpbuf[0] = '%';

#  ifdef HAVE_IF_INDEXTONAME
  is_ll   = IN6_IS_ADDR_LINKLOCAL(&addr6->sin6_addr);
  is_mcll = IN6_IS_ADDR_MC_LINKLOCAL(&addr6->sin6_addr);
  if ((flags & ARES_NI_NUMERICSCOPE) || (!is_ll && !is_mcll)) {
    snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
             (unsigned long)addr6->sin6_scope_id);
  } else {
    if (if_indextoname(addr6->sin6_scope_id, &tmpbuf[1]) == NULL) {
      snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
               (unsigned long)addr6->sin6_scope_id);
    }
  }
#  else
  snprintf(&tmpbuf[1], sizeof(tmpbuf) - 1, "%lu",
           (unsigned long)addr6->sin6_scope_id);
  (void)flags;
#  endif
  tmpbuf[IF_NAMESIZE + 1] = '\0';
  bufl                    = ares_strlen(buf);

  if (bufl + ares_strlen(tmpbuf) < buflen) {
    /* only append the scopeid string if it fits in the target buffer */
    ares_strcpy(&buf[bufl], tmpbuf, buflen - bufl);
  }
}